

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O1

int mg_session_read_chunk(mg_session *session)

{
  ushort uVar1;
  int iVar2;
  char *fmt;
  uint16_t chunk_size;
  ushort local_a;
  
  mg_transport_suspend_until_ready_to_read(session->transport);
  iVar2 = mg_transport_recv(session->transport,(char *)&local_a,2);
  if (iVar2 == 0) {
    uVar1 = local_a << 8 | local_a >> 8;
    if (local_a == 0) {
      return 0;
    }
    local_a = uVar1;
    iVar2 = mg_session_ensure_space_for_chunk(session,(ulong)uVar1);
    if (iVar2 != 0) {
      return iVar2;
    }
    mg_transport_suspend_until_ready_to_read(session->transport);
    iVar2 = mg_transport_recv(session->transport,session->in_buffer + session->in_end,(ulong)local_a
                             );
    if (iVar2 == 0) {
      session->in_end = session->in_end + (ulong)local_a;
      return 1;
    }
    fmt = "failed to receive chunk data";
  }
  else {
    fmt = "failed to receive chunk size";
  }
  mg_session_set_error(session,fmt);
  return -2;
}

Assistant:

int mg_session_read_chunk(mg_session *session) {
  uint16_t chunk_size;
  mg_transport_suspend_until_ready_to_read(session->transport);
  if (mg_transport_recv(session->transport, (char *)&chunk_size, 2) != 0) {
    mg_session_set_error(session, "failed to receive chunk size");
    return MG_ERROR_RECV_FAILED;
  }
  chunk_size = be16toh(chunk_size);
  if (chunk_size == 0) {
    return 0;
  }
  {
    int status = mg_session_ensure_space_for_chunk(session, chunk_size);
    if (status != 0) {
      return status;
    }
  }
  mg_transport_suspend_until_ready_to_read(session->transport);
  if (mg_transport_recv(session->transport,
                        session->in_buffer + session->in_end,
                        chunk_size) != 0) {
    mg_session_set_error(session, "failed to receive chunk data");
    return MG_ERROR_RECV_FAILED;
  }
  session->in_end += chunk_size;
  return 1;
}